

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoQuad> *this,TPZVec<long> *nodeindexes)

{
  long lVar1;
  
  TPZGeoQuad::TPZGeoQuad(&this->super_TPZGeoQuad,&PTR_PTR_016c4268,nodeindexes);
  (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_016c4210;
  lVar1 = 0x40;
  do {
    *(undefined ***)
     ((long)(this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes
     + lVar1 + -0x18) = &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes
     + lVar1 + -8) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes
     + lVar1 + -0x10) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xd0);
  lVar1 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)(&this->field_0xc0 + lVar1));
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x9c0);
  return;
}

Assistant:

TPZGeoBlend(TPZVec<int64_t> &nodeindexes) : TPZRegisterClassId(&TPZGeoBlend::ClassId),
                                                    TGeo(nodeindexes) {
        }